

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],char *params_1,
          char (*params_2) [2],StringPtr *params_3,char (*params_4) [3],String *params_5)

{
  char (*pacVar1) [2];
  char *value;
  StringPtr *value_00;
  char (*value_01) [3];
  String *value_02;
  String *params_5_00;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  char local_49 [1];
  ArrayPtr<const_char> local_48;
  StringPtr *local_38;
  char (*params_local_4) [3];
  StringPtr *params_local_3;
  char (*params_local_2) [2];
  char *params_local_1;
  char (*params_local) [2];
  
  params_5_00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (char (*) [3])params_2;
  params_local_3 = (StringPtr *)params_1;
  params_local_2 = params;
  params_local_1 = (char *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  pacVar1 = ::const((char (*) [2])this);
  local_48 = toCharSequence<char_const(&)[2]>(pacVar1);
  value = fwd<char&>(*params_local_2);
  local_49[0] = (char)toCharSequence<char&>(value);
  pacVar1 = ::const((char (*) [2])params_local_3);
  local_60 = toCharSequence<char_const(&)[2]>(pacVar1);
  value_00 = fwd<kj::StringPtr&>((StringPtr *)params_local_4);
  local_70 = toCharSequence<kj::StringPtr&>(value_00);
  value_01 = ::const((char (*) [3])local_38);
  local_80 = toCharSequence<char_const(&)[3]>(value_01);
  value_02 = fwd<kj::String&>((String *)params_4);
  local_90 = toCharSequence<kj::String&>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_5_00,(_ *)&local_48,(ArrayPtr<const_char> *)local_49,
             (FixedArray<char,_1UL> *)&local_60,&local_70,&local_80,&local_90,
             (ArrayPtr<const_char> *)params_5_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}